

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

ArrayRegOpnd * __thiscall IR::ArrayRegOpnd::CloneDefInternalSub(ArrayRegOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  StackSym *headSegmentSym;
  StackSym *headSegmentLengthSym;
  StackSym *lengthSym;
  ArrayRegOpnd *pAVar5;
  
  if ((this->super_RegOpnd).super_Opnd.m_kind == OpndKindReg) {
    bVar2 = RegOpnd::IsArrayRegOpnd(&this->super_RegOpnd);
    if (bVar2) goto LAB_0061a993;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                     ,0x559,"(m_kind == OpndKindReg && this->IsArrayRegOpnd())",
                     "m_kind == OpndKindReg && this->IsArrayRegOpnd()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_0061a993:
  pSVar4 = (this->super_RegOpnd).m_sym;
  if (pSVar4 == (StackSym *)0x0) {
    pSVar4 = (StackSym *)0x0;
  }
  else {
    pSVar4 = StackSym::CloneDef(pSVar4,func);
  }
  if (this->headSegmentSym == (StackSym *)0x0) {
    headSegmentSym = (StackSym *)0x0;
  }
  else {
    headSegmentSym = StackSym::CloneUse(this->headSegmentSym,func);
  }
  if (this->headSegmentLengthSym == (StackSym *)0x0) {
    headSegmentLengthSym = (StackSym *)0x0;
  }
  else {
    headSegmentLengthSym = StackSym::CloneUse(this->headSegmentLengthSym,func);
  }
  if (this->lengthSym == (StackSym *)0x0) {
    lengthSym = (StackSym *)0x0;
  }
  else {
    lengthSym = StackSym::CloneUse(this->lengthSym,func);
  }
  pAVar5 = Clone(this,pSVar4,headSegmentSym,headSegmentLengthSym,lengthSym,func);
  return pAVar5;
}

Assistant:

ArrayRegOpnd *ArrayRegOpnd::CloneDefInternalSub(Func *func)
{
    Assert(m_kind == OpndKindReg && this->IsArrayRegOpnd());
    return
        Clone(
            m_sym ? m_sym->CloneDef(func) : nullptr,
            headSegmentSym ? headSegmentSym->CloneUse(func) : nullptr,
            headSegmentLengthSym ? headSegmentLengthSym->CloneUse(func) : nullptr,
            lengthSym ? lengthSym->CloneUse(func) : nullptr,
            func);
}